

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

void Saig_ManBmcTerSimTestPo(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  
  p_00 = Saig_ManBmcTerSimPo(p);
  Vec_PtrFreeFree(p_00);
  return;
}

Assistant:

void Saig_ManBmcTerSimTestPo( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    vInfos = Saig_ManBmcTerSimPo( p );
    Vec_PtrFreeFree( vInfos );
}